

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_SetWithDefaults_Test::TestBody(TApp_SetWithDefaults_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  AssertHelper local_158;
  Message local_150 [2];
  ArgumentMismatch *anon_var_0;
  char *pcStack_138;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  iterator local_e0;
  size_type local_d8;
  allocator local_c9;
  string local_c8;
  allocator<int> local_a2;
  less<int> local_a1;
  int local_a0 [4];
  iterator local_90;
  size_type local_88;
  set<int,_std::less<int>,_std::allocator<int>_> local_80;
  allocator local_39;
  string local_38;
  int local_14;
  TApp_SetWithDefaults_Test *pTStack_10;
  int someint;
  TApp_SetWithDefaults_Test *this_local;
  
  local_14 = 2;
  pTStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"-a",&local_39);
  local_a0[0] = 1;
  local_a0[1] = 2;
  local_a0[2] = 3;
  local_a0[3] = 4;
  local_90 = local_a0;
  local_88 = 4;
  CLI::std::allocator<int>::allocator(&local_a2);
  __l_00._M_len = local_88;
  __l_00._M_array = local_90;
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&local_80,__l_00,&local_a1,&local_a2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  CLI::App::add_set<int>(&(this->super_TApp).app,&local_38,&local_14,&local_80,&local_c8,true);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_80);
  CLI::std::allocator<int>::~allocator(&local_a2);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"-a1",(allocator *)((long)&gtest_msg.value + 7))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"-a2",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_e0 = &local_120;
  local_d8 = 2;
  __l._M_len = 2;
  __l._M_array = local_e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_1a8 = local_1a8 + -1;
    std::__cxx11::string::~string((string *)local_1a8);
  } while (local_1a8 != &local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffec8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffec8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      return;
    }
    pcStack_138 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_158,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x50b,pcStack_138);
  testing::internal::AssertHelper::operator=(&local_158,local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::Message::~Message(local_150);
  return;
}

Assistant:

TEST_F(TApp, SetWithDefaults) {
    int someint = 2;
    app.add_set("-a", someint, {1, 2, 3, 4}, "", true);

    args = {"-a1", "-a2"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}